

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Expr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *this)

{
  char code;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  int opcode;
  StringLiteral SVar3;
  LogicalExpr condition;
  Expr then_expr;
  Expr else_expr;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71> BVar4;
  NumericExpr NVar5;
  StringRef value;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  code = *pcVar1;
  if (code == 'o') {
    opcode = ReadOpCode(this);
    if (opcode == 0x41) {
      condition = ReadLogicalExpr(this);
      then_expr = ReadSymbolicExpr(this);
      else_expr = ReadSymbolicExpr(this);
      BVar4 = BasicExprFactory<std::allocator<char>>::
              MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                        ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,
                         (LogicalExpr)condition.super_ExprBase.impl_,
                         (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)
                         then_expr.super_ExprBase.impl_,
                         (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)
                         else_expr.super_ExprBase.impl_);
      return (Expr)BVar4.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.
                   impl_;
    }
    NVar5 = ReadNumericExpr(this,opcode);
    return (Expr)NVar5.super_ExprBase.impl_;
  }
  if (code == 'h') {
    pNVar2 = this->handler_;
    value = BinaryReader<mp::internal::EndiannessConverter>::ReadString(this_00);
    SVar3 = BasicExprFactory<std::allocator<char>_>::MakeStringLiteral
                      (&pNVar2->builder_->super_ExprFactory,value);
    return (Expr)SVar3.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_;
  }
  NVar5 = ReadNumericExpr(this,code,false);
  return (Expr)NVar5.super_ExprBase.impl_;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}